

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O1

void __thiscall polyscope::SlicePlane::setTransform(SlicePlane *this,mat4 newTransform)

{
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar1;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar2;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar3;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar4;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar5;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar6;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar7;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar8;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar9;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar10;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar11;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar12;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar13;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar14;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar15;
  mapped_type *pmVar16;
  
  (this->objectTransform).value.value[0].field_0 = newTransform.value[0].field_0;
  (this->objectTransform).value.value[0].field_1 = newTransform.value[0].field_1;
  (this->objectTransform).value.value[0].field_2 = newTransform.value[0].field_2;
  (this->objectTransform).value.value[0].field_3 = newTransform.value[0].field_3;
  (this->objectTransform).value.value[1].field_0 = newTransform.value[1].field_0;
  (this->objectTransform).value.value[1].field_1 = newTransform.value[1].field_1;
  (this->objectTransform).value.value[1].field_2 = newTransform.value[1].field_2;
  (this->objectTransform).value.value[1].field_3 = newTransform.value[1].field_3;
  (this->objectTransform).value.value[2].field_0 = newTransform.value[2].field_0;
  (this->objectTransform).value.value[2].field_1 = newTransform.value[2].field_1;
  (this->objectTransform).value.value[2].field_2 = newTransform.value[2].field_2;
  (this->objectTransform).value.value[2].field_3 = newTransform.value[2].field_3;
  (this->objectTransform).value.value[3].field_0 = newTransform.value[3].field_0;
  (this->objectTransform).value.value[3].field_1 = newTransform.value[3].field_1;
  (this->objectTransform).value.value[3].field_2 = newTransform.value[3].field_2;
  (this->objectTransform).value.value[3].field_3 = newTransform.value[3].field_3;
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&detail::persistentCache_glmmat4,&(this->objectTransform).name);
  aVar1 = (this->objectTransform).value.value[0].field_1;
  aVar2 = (this->objectTransform).value.value[0].field_2;
  aVar3 = (this->objectTransform).value.value[0].field_3;
  aVar4 = (this->objectTransform).value.value[1].field_0;
  aVar5 = (this->objectTransform).value.value[1].field_1;
  aVar6 = (this->objectTransform).value.value[1].field_2;
  aVar7 = (this->objectTransform).value.value[1].field_3;
  aVar8 = (this->objectTransform).value.value[2].field_0;
  aVar9 = (this->objectTransform).value.value[2].field_1;
  aVar10 = (this->objectTransform).value.value[2].field_2;
  aVar11 = (this->objectTransform).value.value[2].field_3;
  aVar12 = (this->objectTransform).value.value[3].field_0;
  aVar13 = (this->objectTransform).value.value[3].field_1;
  aVar14 = (this->objectTransform).value.value[3].field_2;
  aVar15 = (this->objectTransform).value.value[3].field_3;
  pmVar16->value[0].field_0 = (this->objectTransform).value.value[0].field_0;
  pmVar16->value[0].field_1 = aVar1;
  pmVar16->value[0].field_2 = aVar2;
  pmVar16->value[0].field_3 = aVar3;
  pmVar16->value[1].field_0 = aVar4;
  pmVar16->value[1].field_1 = aVar5;
  pmVar16->value[1].field_2 = aVar6;
  pmVar16->value[1].field_3 = aVar7;
  pmVar16->value[2].field_0 = aVar8;
  pmVar16->value[2].field_1 = aVar9;
  pmVar16->value[2].field_2 = aVar10;
  pmVar16->value[2].field_3 = aVar11;
  pmVar16->value[3].field_0 = aVar12;
  pmVar16->value[3].field_1 = aVar13;
  pmVar16->value[3].field_2 = aVar14;
  pmVar16->value[3].field_3 = aVar15;
  requestRedraw();
  return;
}

Assistant:

void SlicePlane::setTransform(glm::mat4 newTransform) {
  objectTransform = newTransform;
  polyscope::requestRedraw();
}